

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRender.hpp
# Opt level: O2

void __thiscall
vkt::sr::ShaderRenderCaseInstance::BufferUniform::~BufferUniform(BufferUniform *this)

{
  ~BufferUniform(this);
  operator_delete(this,0x48);
  return;
}

Assistant:

virtual						~BufferUniform	(void) {}